

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O0

cmCMakePath * __thiscall
cmCMakePath::Absolute(cmCMakePath *__return_storage_ptr__,cmCMakePath *this,path *base)

{
  bool bVar1;
  string local_78;
  undefined1 local_48 [8];
  path path;
  path *base_local;
  cmCMakePath *this_local;
  
  path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )base;
  bVar1 = std::filesystem::__cxx11::path::is_relative(&this->Path);
  if (bVar1) {
    std::filesystem::__cxx11::path::path
              ((path *)local_48,
               (path *)path._M_cmpts._M_impl._M_t.
                       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                       ._M_head_impl);
    std::filesystem::__cxx11::path::operator/=((path *)local_48,&this->Path);
    std::filesystem::__cxx11::path::generic_string(&local_78,(path *)local_48);
    cmCMakePath<std::__cxx11::string,cmCMakePath&>(__return_storage_ptr__,&local_78,generic_format);
    std::__cxx11::string::~string((string *)&local_78);
    std::filesystem::__cxx11::path::~path((path *)local_48);
  }
  else {
    cmCMakePath(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::Absolute(const cm::filesystem::path& base) const
{
  if (this->Path.is_relative()) {
    auto path = base;
    path /= this->Path;
    // filesystem::path::operator/= use preferred_separator ('\' on Windows)
    // so converts back to '/'
    return path.generic_string();
  }
  return *this;
}